

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MesmerizeOptions.cpp
# Opt level: O3

MesmerizeOptions *
MesmerizeOptions::FromArgs(MesmerizeOptions *__return_storage_ptr__,int argc,char **argv)

{
  _Alloc_hider __nptr;
  long *plVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  runtime_error *prVar5;
  undefined8 uVar6;
  ulong uVar7;
  string resXstr;
  string optionName;
  string optionValue;
  string arg;
  string path;
  string resYstr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long *local_d8;
  char *local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string *local_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  ulong local_60;
  char **local_58;
  long *local_50 [2];
  long local_40 [2];
  
  __return_storage_ptr__->IsFullScreen = false;
  __return_storage_ptr__->IsResolutionSetToMax = true;
  __return_storage_ptr__->ResolutionX = -1;
  __return_storage_ptr__->ResolutionY = -1;
  __return_storage_ptr__->DisplayPictureDuration = 15000;
  __return_storage_ptr__->OpacityAnimationDuration = 4000;
  __return_storage_ptr__->ZoomAnimationDuration = 20000;
  __return_storage_ptr__->PanAnimationDuration = 10000;
  __return_storage_ptr__->ZoomPercentage = 0.05;
  __return_storage_ptr__->PanPercentage = 0.05;
  local_88 = (string *)&__return_storage_ptr__->PathToPicturesFolder;
  local_90 = &(__return_storage_ptr__->PathToPicturesFolder).field_2;
  (__return_storage_ptr__->PathToPicturesFolder)._M_dataplus._M_p = (pointer)local_90;
  (__return_storage_ptr__->PathToPicturesFolder)._M_string_length = 0;
  (__return_storage_ptr__->PathToPicturesFolder).field_2._M_local_buf[0] = '\0';
  local_80 = local_70;
  local_58 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  if (1 < argc) {
    uVar7 = 1;
    local_60 = (ulong)(uint)argc;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,local_58[uVar7],(allocator<char> *)&local_f8);
      lVar3 = std::__cxx11::string::find((char *)&local_b8,0x13b89a,0);
      if (lVar3 == -1) {
        iVar2 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar2 != 0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_f8,"Invalid arg ",&local_b8);
          std::runtime_error::runtime_error(prVar5,(string *)&local_f8);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::_M_assign((string *)&local_80);
      }
      else {
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        local_d8 = (long *)&local_c8;
        local_d0 = (char *)0x0;
        local_c8 = 0;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        lVar3 = std::__cxx11::string::find((char *)&local_b8,0x13b8aa,0);
        if (lVar3 == -1) {
          std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_b8);
          std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x13bb04);
        }
        else {
          std::__cxx11::string::find((char *)&local_b8,0x13b8aa,0);
          std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_b8);
          std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::find((char *)&local_b8,0x13b8aa,0);
          std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_b8);
          std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
        }
        iVar2 = std::__cxx11::string::compare((char *)&local_f8);
        if (iVar2 == 0) {
          __return_storage_ptr__->IsFullScreen = true;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_f8);
          if (iVar2 == 0) {
            __return_storage_ptr__->IsFullScreen = false;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_f8);
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::string::compare((char *)&local_f8);
              plVar1 = local_d8;
              if (iVar2 == 0) {
                piVar4 = __errno_location();
                iVar2 = *piVar4;
                *piVar4 = 0;
                lVar3 = strtol((char *)plVar1,(char **)&local_118,10);
                if ((long *)local_118._M_dataplus._M_p != plVar1) {
                  if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar4 != 0x22)) {
                    if (*piVar4 == 0) {
                      *piVar4 = iVar2;
                    }
                    __return_storage_ptr__->DisplayPictureDuration = (int)lVar3 * 1000;
                    goto LAB_00110b01;
                  }
                  std::__throw_out_of_range("stoi");
                }
                std::__throw_invalid_argument("stoi");
LAB_00110c68:
                std::__throw_out_of_range("stoi");
LAB_00110c74:
                std::__throw_invalid_argument("stoi");
LAB_00110c80:
                std::__throw_out_of_range("stoi");
                goto LAB_00110c8c;
              }
              iVar2 = std::__cxx11::string::compare((char *)&local_f8);
              plVar1 = local_d8;
              if (iVar2 == 0) {
                piVar4 = __errno_location();
                iVar2 = *piVar4;
                *piVar4 = 0;
                lVar3 = strtol((char *)plVar1,(char **)&local_118,10);
                if ((long *)local_118._M_dataplus._M_p != plVar1) {
                  if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar4 != 0x22)) {
                    if (*piVar4 == 0) {
                      *piVar4 = iVar2;
                    }
                    __return_storage_ptr__->OpacityAnimationDuration = (int)lVar3 * 1000;
                    goto LAB_00110b01;
                  }
                  std::__throw_out_of_range("stoi");
                }
                std::__throw_invalid_argument("stoi");
LAB_00110ce4:
                std::__throw_out_of_range("stoi");
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_f8);
                plVar1 = local_d8;
                if (iVar2 != 0) {
                  iVar2 = std::__cxx11::string::compare((char *)&local_f8);
                  plVar1 = local_d8;
                  if (iVar2 == 0) {
                    piVar4 = __errno_location();
                    iVar2 = *piVar4;
                    *piVar4 = 0;
                    lVar3 = strtol((char *)plVar1,(char **)&local_118,10);
                    if ((long *)local_118._M_dataplus._M_p != plVar1) {
                      if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar4 != 0x22)) {
                        if (*piVar4 == 0) {
                          *piVar4 = iVar2;
                        }
                        __return_storage_ptr__->PanAnimationDuration = (int)lVar3 * 1000;
                        goto LAB_00110b01;
                      }
                      goto LAB_00110d5f;
                    }
LAB_00110d6b:
                    std::__throw_invalid_argument("stoi");
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)&local_f8);
                    plVar1 = local_d8;
                    if (iVar2 != 0) {
                      iVar2 = std::__cxx11::string::compare((char *)&local_f8);
                      plVar1 = local_d8;
                      if (iVar2 != 0) goto LAB_00110cfc;
                      piVar4 = __errno_location();
                      iVar2 = *piVar4;
                      *piVar4 = 0;
                      lVar3 = strtol((char *)plVar1,(char **)&local_118,10);
                      if ((long *)local_118._M_dataplus._M_p != plVar1) {
                        if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar4 != 0x22)) {
                          if (*piVar4 == 0) {
                            *piVar4 = iVar2;
                          }
                          __return_storage_ptr__->PanPercentage = (float)(int)lVar3 / 100.0;
                          goto LAB_00110b01;
                        }
                        std::__throw_out_of_range("stoi");
                      }
                      std::__throw_invalid_argument("stoi");
LAB_00110d5f:
                      std::__throw_out_of_range("stoi");
                      goto LAB_00110d6b;
                    }
                    piVar4 = __errno_location();
                    iVar2 = *piVar4;
                    *piVar4 = 0;
                    lVar3 = strtol((char *)plVar1,(char **)&local_118,10);
                    if ((long *)local_118._M_dataplus._M_p == plVar1) goto LAB_00110d83;
                    if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar4 != 0x22)) {
                      if (*piVar4 == 0) {
                        *piVar4 = iVar2;
                      }
                      __return_storage_ptr__->ZoomPercentage = (float)(int)lVar3 / 100.0;
                      goto LAB_00110b01;
                    }
                  }
                  std::__throw_out_of_range("stoi");
LAB_00110d83:
                  uVar6 = std::__throw_invalid_argument("stoi");
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    local_118.field_2._M_allocated_capacity + 1);
                  }
                  if ((char)uVar7 != '\0') {
                    __cxa_free_exception(piVar4);
                  }
                  if (local_d8 != (long *)&local_c8) {
                    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                    operator_delete(local_f8._M_dataplus._M_p,
                                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                             local_f8.field_2._M_local_buf[0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,
                                    local_b8.field_2._M_allocated_capacity + 1);
                  }
                  if (local_80 != local_70) {
                    operator_delete(local_80,local_70[0] + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*(long **)local_88 != local_90) {
                    operator_delete(*(long **)local_88,local_90->_M_allocated_capacity + 1);
                  }
                  _Unwind_Resume(uVar6);
                }
                piVar4 = __errno_location();
                iVar2 = *piVar4;
                *piVar4 = 0;
                lVar3 = strtol((char *)plVar1,(char **)&local_118,10);
                if ((long *)local_118._M_dataplus._M_p != plVar1) {
                  if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar4 != 0x22)) {
                    if (*piVar4 == 0) {
                      *piVar4 = iVar2;
                    }
                    __return_storage_ptr__->ZoomAnimationDuration = (int)lVar3 * 1000;
                    goto LAB_00110b01;
                  }
                  goto LAB_00110ce4;
                }
              }
              std::__throw_invalid_argument("stoi");
LAB_00110cfc:
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_118,"Unknown option: ",&local_f8);
              std::runtime_error::runtime_error(prVar5,(string *)&local_118);
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            lVar3 = std::__cxx11::string::find((char *)&local_d8,0x13b8c3,0);
            if (lVar3 != 0) {
              lVar3 = std::__cxx11::string::find((char *)&local_d8,0x13b8c5,0);
              if (lVar3 == -1) goto LAB_00110c98;
              std::__cxx11::string::find((char *)&local_d8,0x13b8c5,0);
              std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_d8);
              std::__cxx11::string::find((char *)&local_d8,0x13b8c5,0);
              std::__cxx11::string::substr((ulong)local_50,(ulong)&local_d8);
              __nptr._M_p = local_118._M_dataplus._M_p;
              __return_storage_ptr__->IsResolutionSetToMax = false;
              piVar4 = __errno_location();
              iVar2 = *piVar4;
              *piVar4 = 0;
              lVar3 = strtol(__nptr._M_p,(char **)&local_98,10);
              plVar1 = local_50[0];
              if (local_98 != (long *)__nptr._M_p) {
                if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar4 != 0x22)) {
                  if (*piVar4 == 0) {
                    *piVar4 = iVar2;
                  }
                  __return_storage_ptr__->ResolutionX = (int)lVar3;
                  iVar2 = *piVar4;
                  *piVar4 = 0;
                  lVar3 = strtol((char *)local_50[0],(char **)&local_98,10);
                  if (local_98 != plVar1) {
                    if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar4 != 0x22)) {
                      if (*piVar4 == 0) {
                        *piVar4 = iVar2;
                      }
                      __return_storage_ptr__->ResolutionY = (int)lVar3;
                      if (local_50[0] != local_40) {
                        operator_delete(local_50[0],local_40[0] + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != &local_118.field_2) {
                        operator_delete(local_118._M_dataplus._M_p,
                                        local_118.field_2._M_allocated_capacity + 1);
                      }
                      goto LAB_00110b01;
                    }
                    goto LAB_00110c68;
                  }
                  goto LAB_00110c74;
                }
                goto LAB_00110c80;
              }
LAB_00110c8c:
              std::__throw_invalid_argument("stoi");
LAB_00110c98:
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar5,
                         "resolution option value is using an incorrect format, correct format is widthxheight"
                        );
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            __return_storage_ptr__->IsResolutionSetToMax = true;
            __return_storage_ptr__->ResolutionX = -1;
            __return_storage_ptr__->ResolutionY = -1;
          }
        }
LAB_00110b01:
        if (local_d8 != (long *)&local_c8) {
          operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
    } while (local_60 != uVar7);
  }
  if (local_78 == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Path to root picture folder missing");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_assign(local_88);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

MesmerizeOptions MesmerizeOptions::FromArgs(int argc, const char** argv) {
    MesmerizeOptions options;
    std::string path = "";
    for(int i = 1; i < argc; i++) {
        std::string arg(argv[i]);
        if (arg.find("--") == std::string::npos) {
            if (path.compare("") != 0)
                throw std::runtime_error("Invalid arg " + arg);

            path = arg; //we assume that the non-option (no --) is the path
        }else{
            std::string optionName;
            std::string optionValue;

            if (arg.find("=") == std::string::npos) {
                optionName = arg.substr(2);
                optionValue = "";
            } else {
                optionName = arg.substr(2, arg.find("=") - 2);
                optionValue = arg.substr(arg.find("=") + 1);
            }
            if (!optionName.compare("full-screen")){
                options.IsFullScreen = true;
            }else if (!optionName.compare("window")){
                options.IsFullScreen = false;
            }else if (!optionName.compare("resolution")) {
                if (optionValue.find("max") == 0) {
                    options.IsResolutionSetToMax = true;
                    options.ResolutionX = -1;
                    options.ResolutionY = -1;
                } else {
                    if (optionValue.find("x") == std::string::npos)
                        throw std::runtime_error(
                                "resolution option value is using an incorrect format, correct format is widthxheight");
                    std::string resXstr = optionValue.substr(0, optionValue.find("x"));
                    std::string resYstr = optionValue.substr(optionValue.find("x") + 1);
                    options.IsResolutionSetToMax = false;
                    options.ResolutionX = std::stoi(resXstr);
                    options.ResolutionY = std::stoi(resYstr);
                }
            }else if (!optionName.compare("display-picture-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.DisplayPictureDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("opacity-animation-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.OpacityAnimationDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("zoom-animation-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.ZoomAnimationDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("pan-animation-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.PanAnimationDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("zoom-percentage")) {
                int zoomPercentage = std::stoi(optionValue);
                options.ZoomPercentage = zoomPercentage / 100.0f;
            }else if (!optionName.compare("pan-percentage")) {
                int panPercentage = std::stoi(optionValue);
                options.PanPercentage = panPercentage / 100.0f;
            }else {
                throw std::runtime_error("Unknown option: " + optionName);
            }
        }
    }



    if (path.empty()){
        throw std::runtime_error("Path to root picture folder missing");
    }else {
        options.PathToPicturesFolder = path;
    }
    return options;
}